

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsidebar_p.cpp
# Opt level: O2

void QUrlModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  iterator path;
  iterator iVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 *puStack_a8;
  undefined1 *puStack_a0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_98;
  QArrayDataPointer<char16_t> QStack_90;
  undefined1 *puStack_78;
  undefined1 *puStack_70;
  QAbstractItemModel *pQStack_68;
  QArrayDataPointer<QString> QStack_58;
  long lStack_38;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
      QStack_58.d = (Data *)0x0;
      QStack_58.ptr = (QString *)0x0;
      QStack_58.size = 0;
      QList<QString>::reserve((QList<QString> *)&QStack_58,*(qsizetype *)(_o + 0x30));
      lVar3 = *(long *)(_o + 0x28);
      for (lVar2 = *(long *)(_o + 0x30) * 0x30; lVar2 != 0; lVar2 = lVar2 + -0x30) {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)&QStack_58,(QString *)(lVar3 + 0x18));
        lVar3 = lVar3 + 0x30;
      }
      QList<QUrlModel::WatchItem>::clear((QList<QUrlModel::WatchItem> *)(_o + 0x20));
      path = QList<QString>::begin((QList<QString> *)&QStack_58);
      iVar1 = QList<QString>::end((QList<QString> *)&QStack_58);
      for (; path.i != iVar1.i; path.i = path.i + 1) {
        pQStack_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QFileSystemModel::index((QString *)&puStack_78,(int)*(undefined8 *)(_o + 0x18));
        tStack_98.ptr = pQStack_68;
        puStack_a8 = puStack_78;
        puStack_a0 = puStack_70;
        QStack_90.d = ((path.i)->d).d;
        QStack_90.ptr = ((path.i)->d).ptr;
        QStack_90.size = ((path.i)->d).size;
        if (QStack_90.d != (Data *)0x0) {
          LOCK();
          ((QStack_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((QStack_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QList<QUrlModel::WatchItem>::emplaceBack<QUrlModel::WatchItem>
                  ((QList<QUrlModel::WatchItem> *)(_o + 0x20),(WatchItem *)&puStack_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_90);
        if (((-1 < (int)puStack_78) && (-1 < (long)puStack_78)) &&
           (pQStack_68 != (QAbstractItemModel *)0x0)) {
          changed((QUrlModel *)_o,path.i);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
        return;
      }
      __stack_chk_fail();
    }
    if (_id == 0) {
      dataChanged((QUrlModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
      return;
    }
  }
  return;
}

Assistant:

void QUrlModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUrlModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 1: _t->layoutChanged(); break;
        default: ;
        }
    }
}